

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O0

uint Aig_ManRandom(int fReset)

{
  int fReset_local;
  
  if (fReset != 0) {
    Aig_ManRandom::m_z = 0xdd8c5109;
    Aig_ManRandom::m_w = 0x81962ff0;
  }
  Aig_ManRandom::m_z = (Aig_ManRandom::m_z & 0xffff) * 0x9069 + (Aig_ManRandom::m_z >> 0x10);
  Aig_ManRandom::m_w = (Aig_ManRandom::m_w & 0xffff) * 18000 + (Aig_ManRandom::m_w >> 0x10);
  return Aig_ManRandom::m_z * 0x10000 + Aig_ManRandom::m_w;
}

Assistant:

unsigned Aig_ManRandom( int fReset )
{
    static unsigned int m_z = NUMBER1;
    static unsigned int m_w = NUMBER2;
    if ( fReset )
    {
        m_z = NUMBER1;
        m_w = NUMBER2;
    }
    m_z = 36969 * (m_z & 65535) + (m_z >> 16);
    m_w = 18000 * (m_w & 65535) + (m_w >> 16);
    return (m_z << 16) + m_w;
}